

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  Node *block;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  TValue *pTVar5;
  int *piVar6;
  TValue *pTVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  iVar10 = t->sizearray;
  bVar1 = t->lsizenode;
  block = t->node;
  if (iVar10 < nasize) {
    if (nasize < -1) goto LAB_001107ad;
    pTVar5 = (TValue *)luaM_realloc_(L,t->array,(long)iVar10 << 4,(long)nasize << 4);
    t->array = pTVar5;
    auVar4 = _DAT_0011d020;
    auVar3 = _DAT_0011d010;
    auVar2 = _DAT_0011d000;
    iVar9 = t->sizearray;
    if (iVar9 < nasize) {
      lVar11 = (long)nasize - (long)iVar9;
      lVar12 = lVar11 + -1;
      auVar14._8_4_ = (int)lVar12;
      auVar14._0_8_ = lVar12;
      auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
      piVar6 = &pTVar5[(long)iVar9 + 3].tt_;
      uVar8 = 0;
      auVar14 = auVar14 ^ _DAT_0011d020;
      do {
        auVar15._8_4_ = (int)uVar8;
        auVar15._0_8_ = uVar8;
        auVar15._12_4_ = (int)(uVar8 >> 0x20);
        auVar16 = (auVar15 | auVar3) ^ auVar4;
        iVar9 = auVar14._4_4_;
        if ((bool)(~(auVar16._4_4_ == iVar9 && auVar14._0_4_ < auVar16._0_4_ ||
                    iVar9 < auVar16._4_4_) & 1)) {
          piVar6[-0xc] = 0;
        }
        if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
            auVar16._12_4_ <= auVar14._12_4_) {
          piVar6[-8] = 0;
        }
        auVar15 = (auVar15 | auVar2) ^ auVar4;
        iVar17 = auVar15._4_4_;
        if (iVar17 <= iVar9 && (iVar17 != iVar9 || auVar15._0_4_ <= auVar14._0_4_)) {
          piVar6[-4] = 0;
          *piVar6 = 0;
        }
        uVar8 = uVar8 + 4;
        piVar6 = piVar6 + 0x10;
      } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar8);
    }
    t->sizearray = nasize;
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar10) {
    t->sizearray = nasize;
    lVar11 = (long)nasize << 4;
    iVar9 = nasize + 1;
    do {
      if (*(int *)((long)&t->array->tt_ + lVar11) != 0) {
        luaH_setint(L,t,iVar9,(TValue *)((long)&t->array->value_ + lVar11));
      }
      lVar11 = lVar11 + 0x10;
      bVar13 = iVar9 != iVar10;
      iVar9 = iVar9 + 1;
    } while (bVar13);
    if (nasize < -1) {
LAB_001107ad:
      luaM_toobig(L);
    }
    pTVar5 = (TValue *)luaM_realloc_(L,t->array,(long)iVar10 << 4,(long)nasize << 4);
    t->array = pTVar5;
  }
  iVar10 = 1 << (bVar1 & 0x1f);
  if (bVar1 != 0x1f) {
    iVar9 = iVar10 + 1;
    pTVar5 = (TValue *)&block[iVar10 - 1].i_key;
    do {
      if (pTVar5[-1].tt_ != 0) {
        pTVar7 = luaH_set(L,t,pTVar5);
        pTVar7->value_ = pTVar5[-1].value_;
        pTVar7->tt_ = pTVar5[-1].tt_;
      }
      iVar9 = iVar9 + -1;
      pTVar5 = (TValue *)&pTVar5[-3].tt_;
    } while (1 < iVar9);
  }
  if (block == &dummynode_) {
    return;
  }
  luaM_realloc_(L,block,(long)iVar10 * 0x28,0);
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, int nasize, int nhsize) {
  int i;
  int oldasize = t->sizearray;
  int oldhsize = t->lsizenode;
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  setnodevector(L, t, nhsize);
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (i = twoto(oldhsize) - 1; i >= 0; i--) {
    Node *old = nold+i;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (!isdummy(nold))
    luaM_freearray(L, nold, cast(size_t, twoto(oldhsize))); /* free old array */
}